

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_mark(bitstream *str,uint32_t val,int size)

{
  int iVar1;
  undefined4 in_EDX;
  uint in_ESI;
  uint32_t tmp;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  int local_4;
  
  uVar2 = in_ESI;
  iVar1 = vs_u((bitstream *)CONCAT44(in_ESI,in_EDX),
               (uint32_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  if (iVar1 == 0) {
    if (in_ESI == uVar2) {
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"Marker value invalid: %d vs %d\n",(ulong)in_ESI,(ulong)uVar2);
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int vs_mark(struct bitstream *str, uint32_t val, int size) {
	uint32_t tmp = val;
	if (vs_u(str, &tmp, size)) return 1;
	if (tmp != val) {
		fprintf(stderr, "Marker value invalid: %d vs %d\n", tmp, val);
		return 1;
	}
	return 0;
}